

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rabuilders_p.h
# Opt level: O2

void __thiscall
asmjit::_abi_1_10::RACFGBuilderT<asmjit::_abi_1_10::x86::RACFGBuilder>::_logNode
          (RACFGBuilderT<asmjit::_abi_1_10::x86::RACFGBuilder> *this,BaseNode *node,
          uint32_t indentation,char *action)

{
  StringTmp<512UL> *this_00;
  double __x;
  
  this_00 = &this->_sb;
  String::clear(&this_00->super_String);
  String::appendChars(&this_00->super_String,' ',(ulong)indentation);
  if (action != (char *)0x0) {
    String::append(&this_00->super_String,action,0xffffffffffffffff);
    String::append(&this_00->super_String,' ');
  }
  Formatter::formatNode
            (&this_00->super_String,&this->_formatOptions,&this->_cc->super_BaseBuilder,node);
  String::append(&this_00->super_String,'\n');
  Logger::log(this->_logger,__x);
  return;
}

Assistant:

void _logNode(BaseNode* node, uint32_t indentation, const char* action) noexcept {
    _sb.clear();
    _sb.appendChars(' ', indentation);
    if (action) {
      _sb.append(action);
      _sb.append(' ');
    }
    Formatter::formatNode(_sb, _formatOptions, cc(), node);
    _sb.append('\n');
    _logger->log(_sb);
  }